

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

UnknownFieldSet * __thiscall
google::protobuf::Reflection::GetUnknownFields(Reflection *this,Message *message)

{
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *this_00;
  Reflection *in_RSI;
  Message *in_stack_ffffffffffffffc8;
  undefined8 local_18;
  
  this_00 = (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
             *)GetInternalMetadataWithArena(in_RSI,in_stack_ffffffffffffffc8);
  if (((uint)*(undefined8 *)this_00 & 1) == 1) {
    local_18 = internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
               ::
               PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                         (this_00);
  }
  else {
    local_18 = (Container *)internal::InternalMetadataWithArena::default_instance();
  }
  return &local_18->unknown_fields;
}

Assistant:

const UnknownFieldSet& Reflection::GetUnknownFields(
    const Message& message) const {
  return GetInternalMetadataWithArena(message).unknown_fields();
}